

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O0

void ym2612_reset_chip(void *chip)

{
  FM_OPN2 *OPN_00;
  FM_OPN2 *OPN;
  YM2612 *F2612;
  int i;
  void *chip_local;
  
  OPN_00 = (FM_OPN2 *)((long)chip + 0x208);
  OPNSetPres(OPN_00,0x90,0x90,0);
  FM_IRQMASK_SET((FM_ST2 *)((long)chip + 0x210),3);
  *(undefined4 *)((long)chip + 0x6c4) = 0;
  *(undefined4 *)((long)chip + 0x6c0) = 0;
  *(undefined4 *)((long)chip + 0x46d8) = 0;
  *(undefined1 *)((long)chip + 0x46d4) = 0;
  *(undefined4 *)((long)chip + 0x46e4) = 0x7e;
  *(undefined4 *)((long)chip + 0x46e8) = 0;
  *(undefined4 *)((long)chip + 0x240) = 0;
  *(undefined4 *)((long)chip + 0x248) = 0;
  *(undefined1 *)((long)chip + 0x684) = 0;
  *(undefined1 *)((long)chip + 0x231) = 0;
  *(undefined4 *)((long)chip + 0x234) = 0;
  memset((void *)((long)chip + 8),0,0x200);
  OPNWriteMode(OPN_00,0x22,0);
  OPNWriteMode(OPN_00,0x27,0x30);
  OPNWriteMode(OPN_00,0x26,0);
  OPNWriteMode(OPN_00,0x25,0);
  OPNWriteMode(OPN_00,0x24,0);
  reset_channels((FM_ST2 *)((long)chip + 0x210),(FM_CH *)((long)chip + 0x4718),6);
  for (F2612._4_4_ = 0xb6; 0xb3 < (int)F2612._4_4_; F2612._4_4_ = F2612._4_4_ - 1) {
    OPNWriteReg(OPN_00,F2612._4_4_,0xc0);
    OPNWriteReg(OPN_00,F2612._4_4_ | 0x100,0xc0);
  }
  for (F2612._4_4_ = 0xb2; 0x2f < (int)F2612._4_4_; F2612._4_4_ = F2612._4_4_ - 1) {
    OPNWriteReg(OPN_00,F2612._4_4_,0);
    OPNWriteReg(OPN_00,F2612._4_4_ | 0x100,0);
  }
  *(undefined1 *)((long)chip + 0x50a9) = 0;
  *(undefined1 *)((long)chip + 0x50aa) = 0;
  *(undefined4 *)((long)chip + 0x50ac) = 0;
  *(char *)((long)chip + 0x50b1) = (char)((int)(uint)*(byte *)((long)chip + 0x50b1) >> 1);
  *(undefined4 *)((long)chip + 0x50b8) = 0;
  *(undefined4 *)((long)chip + 0x50b4) = 0;
  return;
}

Assistant:

void ym2612_reset_chip(void *chip)
{
	int i;
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN2 *OPN  = &F2612->OPN;

	OPNSetPres( OPN, 6*24, 6*24, 0);
	/* status clear */
	FM_IRQMASK_SET(&OPN->ST,0x03);
	FM_BUSY_CLEAR(&OPN->ST);
	//OPNWriteMode(OPN,0x27,0x30); /* mode 0 , timer reset */

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->lfo_timer = 0;
	OPN->lfo_cnt   = 0;
	OPN->LFO_AM    = 126;
	OPN->LFO_PM    = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;

	memset(F2612->REGS, 0x00, sizeof(UINT8) * 512);
	
	OPNWriteMode(OPN,0x22,0x00);
	
	OPNWriteMode(OPN,0x27,0x30);
	OPNWriteMode(OPN,0x26,0x00);
	OPNWriteMode(OPN,0x25,0x00);
	OPNWriteMode(OPN,0x24,0x00);

	reset_channels( &OPN->ST , &F2612->CH[0] , 6 );

	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}

	/* DAC mode clear */
	F2612->dacen = 0;
	F2612->dac_test = 0;
	F2612->dacout = 0;
	
	F2612->WaveOutMode >>= 1;
	F2612->WaveL = F2612->WaveR = 0;
}